

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2WithImpl::getRawDecomposition
          (Normalizer2WithImpl *this,UChar32 c,UnicodeString *decomposition)

{
  short sVar1;
  UBool UVar2;
  int32_t length_00;
  int32_t length;
  UChar buffer [30];
  int32_t local_74;
  ConstChar16Ptr local_70 [3];
  UChar local_58 [32];
  
  local_70[0].p_ = Normalizer2Impl::getRawDecomposition(this->impl,c,local_58,&local_74);
  if (local_70[0].p_ == (UChar *)0x0) {
    UVar2 = '\0';
  }
  else {
    if (local_70[0].p_ == local_58) {
      UnicodeString::unBogus(decomposition);
      sVar1 = (decomposition->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length_00 = (decomposition->fUnion).fFields.fLength;
      }
      else {
        length_00 = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(decomposition,0,length_00,local_58,0,local_74);
    }
    else {
      UnicodeString::setTo(decomposition,'\0',local_70,local_74);
    }
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

virtual UBool
    getRawDecomposition(UChar32 c, UnicodeString &decomposition) const {
        UChar buffer[30];
        int32_t length;
        const UChar *d=impl.getRawDecomposition(c, buffer, length);
        if(d==NULL) {
            return FALSE;
        }
        if(d==buffer) {
            decomposition.setTo(buffer, length);  // copy the string (algorithmic decomposition)
        } else {
            decomposition.setTo(FALSE, d, length);  // read-only alias
        }
        return TRUE;
    }